

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_lua_generator.cc
# Opt level: O0

void __thiscall
t_lua_generator::generate_deserialize_struct
          (t_lua_generator *this,ostream *out,t_struct *tstruct,bool local,string *prefix)

{
  int iVar1;
  ostream *poVar2;
  undefined4 extraout_var;
  char *pcVar3;
  string local_50;
  string *local_30;
  string *prefix_local;
  t_struct *ptStack_20;
  bool local_local;
  t_struct *tstruct_local;
  ostream *out_local;
  t_lua_generator *this_local;
  
  local_30 = prefix;
  prefix_local._7_1_ = local;
  ptStack_20 = tstruct;
  tstruct_local = (t_struct *)out;
  out_local = (ostream *)this;
  poVar2 = t_generator::indent((t_generator *)this,out);
  pcVar3 = "";
  if ((prefix_local._7_1_ & 1) != 0) {
    pcVar3 = "local ";
  }
  poVar2 = std::operator<<(poVar2,pcVar3);
  poVar2 = std::operator<<(poVar2,(string *)prefix);
  poVar2 = std::operator<<(poVar2," = ");
  iVar1 = (*(ptStack_20->super_t_type).super_t_doc._vptr_t_doc[3])();
  poVar2 = std::operator<<(poVar2,(string *)CONCAT44(extraout_var,iVar1));
  poVar2 = std::operator<<(poVar2,":new{}");
  poVar2 = std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_50,(t_generator *)this);
  poVar2 = std::operator<<(poVar2,(string *)&local_50);
  poVar2 = std::operator<<(poVar2,(string *)prefix);
  poVar2 = std::operator<<(poVar2,":read(iprot)");
  std::operator<<(poVar2,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_50);
  return;
}

Assistant:

void t_lua_generator::generate_deserialize_struct(ostream& out,
                                                  t_struct* tstruct,
                                                  bool local,
                                                  string prefix) {
  indent(out) << (local ? "local " : "") << prefix << " = " << tstruct->get_name() << ":new{}"
              << endl << indent() << prefix << ":read(iprot)" << endl;
}